

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::AutomakeReporter::skipTest(AutomakeReporter *this,TestCaseInfo *testInfo)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":test-result: SKIP ",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(testInfo->name)._M_dataplus._M_p,(testInfo->name)._M_string_length);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void AutomakeReporter::skipTest(TestCaseInfo const& testInfo) {
        m_stream << ":test-result: SKIP " << testInfo.name << '\n';
    }